

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall
S2BooleanOperation::Impl::IsFullPolygonIntersection(Impl *this,S2ShapeIndex *a,S2ShapeIndex *b)

{
  byte bVar1;
  byte bVar2;
  double *pdVar3;
  double max_area;
  double local_48;
  double local_40;
  double min_area;
  double b_area;
  double a_area;
  S2ShapeIndex *b_local;
  S2ShapeIndex *a_local;
  Impl *this_local;
  
  a_area = (double)b;
  b_local = a;
  a_local = (S2ShapeIndex *)this;
  bVar1 = GetFaceMask(a);
  bVar2 = GetFaceMask((S2ShapeIndex *)a_area);
  if ((bVar1 & bVar2) == 0x3f) {
    b_area = S2::GetArea(b_local);
    min_area = S2::GetArea((S2ShapeIndex *)a_area);
    local_48 = 0.0;
    max_area = (b_area + min_area) - 12.566370614359172;
    pdVar3 = std::max<double>(&local_48,&max_area);
    local_40 = *pdVar3;
    pdVar3 = std::min<double>(&b_area,&min_area);
    this_local._7_1_ = 12.566370614359172 - *pdVar3 < local_40;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool S2BooleanOperation::Impl::IsFullPolygonIntersection(
    const S2ShapeIndex& a, const S2ShapeIndex& b) const {
  // See comments in IsFullPolygonResult().  By far the most common case is
  // that the result is empty.

  // The result can be full only if each of the two input geometries
  // intersects all six faces of the S2 cube.  This test is fast.
  if ((GetFaceMask(a) & GetFaceMask(b)) != kAllFacesMask) return false;

  // The intersection area satisfies:
  //
  //   max(0, A + B - 4*Pi) <= Intersection(A, B) <= min(A, B)
  //
  // where A, B can refer to a polygon or its area.  We then choose the result
  // that assumes the smallest amount of error.
  double a_area = S2::GetArea(a), b_area = S2::GetArea(b);
  double min_area = max(0.0, a_area + b_area - 4 * M_PI);
  double max_area = min(a_area, b_area);
  return min_area > 4 * M_PI - max_area;
}